

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprWhile * AnalyzeWhile(ExpressionContext *ctx,SynWhile *syntax)

{
  TypeBase *pTVar1;
  int iVar2;
  ExprBase *pEVar3;
  ExprBase *pEVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ExprWhile *pEVar5;
  
  ExpressionContext::PushLoopScope(ctx,true,true);
  pEVar3 = AnalyzeExpression(ctx,syntax->condition);
  if (syntax->body == (SynBase *)0x0) {
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
    pEVar4 = (ExprBase *)CONCAT44(extraout_var,iVar2);
    pTVar1 = ctx->typeVoid;
    pEVar4->typeID = 2;
    pEVar4->source = &syntax->super_SynBase;
    pEVar4->type = pTVar1;
    pEVar4->next = (ExprBase *)0x0;
    pEVar4->listed = false;
    pEVar4->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3b40;
  }
  else {
    pEVar4 = AnalyzeStatement(ctx,syntax->body);
  }
  pEVar3 = CreateConditionCast(ctx,pEVar3->source,pEVar3);
  ExpressionContext::PopScope(ctx,SCOPE_LOOP);
  iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
  pEVar5 = (ExprWhile *)CONCAT44(extraout_var_00,iVar2);
  pTVar1 = ctx->typeVoid;
  (pEVar5->super_ExprBase).typeID = 0x31;
  (pEVar5->super_ExprBase).source = &syntax->super_SynBase;
  (pEVar5->super_ExprBase).type = pTVar1;
  (pEVar5->super_ExprBase).next = (ExprBase *)0x0;
  (pEVar5->super_ExprBase).listed = false;
  (pEVar5->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e4010;
  pEVar5->condition = pEVar3;
  pEVar5->body = pEVar4;
  return pEVar5;
}

Assistant:

ExprWhile* AnalyzeWhile(ExpressionContext &ctx, SynWhile *syntax)
{
	ctx.PushLoopScope(true, true);

	ExprBase *condition = AnalyzeExpression(ctx, syntax->condition);
	ExprBase *body = syntax->body ? AnalyzeStatement(ctx, syntax->body) : new (ctx.get<ExprVoid>()) ExprVoid(syntax, ctx.typeVoid);

	condition = CreateConditionCast(ctx, condition->source, condition);

	ctx.PopScope(SCOPE_LOOP);

	return new (ctx.get<ExprWhile>()) ExprWhile(syntax, ctx.typeVoid, condition, body);
}